

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O0

string * __thiscall
cmsys::SystemInformation::GetCPUDescription_abi_cxx11_
          (string *__return_storage_ptr__,SystemInformation *this)

{
  byte bVar1;
  uint uVar2;
  ostream *poVar3;
  char *pcVar4;
  ulong uVar5;
  float fVar6;
  size_t pos;
  string local_1e0;
  string local_1c0;
  undefined1 local_190 [8];
  ostringstream oss;
  SystemInformation *this_local;
  string *tmp;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  uVar2 = GetNumberOfPhysicalCPU(this);
  poVar3 = (ostream *)std::ostream::operator<<(local_190,uVar2);
  std::operator<<(poVar3," core ");
  GetModelName_abi_cxx11_(&local_1c0,this);
  bVar1 = std::__cxx11::string::empty();
  std::__cxx11::string::~string((string *)&local_1c0);
  if ((bVar1 & 1) == 0) {
    GetModelName_abi_cxx11_(&local_1e0,this);
    std::operator<<((ostream *)local_190,(string *)&local_1e0);
    std::__cxx11::string::~string((string *)&local_1e0);
  }
  else {
    fVar6 = GetProcessorClockFrequency(this);
    poVar3 = (ostream *)std::ostream::operator<<(local_190,fVar6);
    poVar3 = std::operator<<(poVar3," MHz ");
    pcVar4 = GetVendorString(this);
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = std::operator<<(poVar3," ");
    pcVar4 = GetExtendedProcessorName(this);
    std::operator<<(poVar3,pcVar4);
  }
  std::__cxx11::ostringstream::str();
  while (uVar5 = std::__cxx11::string::find((char *)__return_storage_ptr__,0xbd0efd),
        uVar5 != 0xffffffffffffffff) {
    std::__cxx11::string::replace((ulong)__return_storage_ptr__,uVar5,(char *)0x2);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string SystemInformation::GetCPUDescription()
{
  std::ostringstream oss;
  oss << this->GetNumberOfPhysicalCPU() << " core ";
  if (this->GetModelName().empty()) {
    oss << this->GetProcessorClockFrequency() << " MHz "
        << this->GetVendorString() << " " << this->GetExtendedProcessorName();
  } else {
    oss << this->GetModelName();
  }

  // remove extra spaces
  std::string tmp = oss.str();
  size_t pos;
  while ((pos = tmp.find("  ")) != std::string::npos) {
    tmp.replace(pos, 2, " ");
  }

  return tmp;
}